

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeEmitter.cpp
# Opt level: O3

void EmitCallInstrNoEvalComponents
               (ParseNodeCall *pnodeCall,BOOL fIsEval,BOOL fHasNewTarget,RegSlot thisLocation,
               RegSlot callObjLocation,uint32 actualArgCount,ByteCodeGenerator *byteCodeGenerator,
               FuncInfo *funcInfo,ProfileId callSiteId,AuxArray<unsigned_int> *spreadIndices)

{
  OpCode OVar1;
  RegSlot Instance;
  ParseNode *this;
  code *pcVar2;
  bool bVar3;
  PropertyId PVar4;
  ParseNodeBin *pPVar5;
  undefined4 *puVar6;
  ParseNodeName *pPVar7;
  
  this = pnodeCall->pnodeTarget;
  OVar1 = this->nop;
  if (OVar1 == knopName) {
    if (callObjLocation != 0xffffffff) {
      if (thisLocation != callObjLocation) {
        FuncInfo::ReleaseTmpRegister(funcInfo,thisLocation);
      }
      FuncInfo::ReleaseTmpRegister(funcInfo,callObjLocation);
      pPVar7 = ParseNode::AsParseNodeName(this);
      PVar4 = ParseNodeName::PropertyIdFromNameNode(pPVar7);
      EmitMethodFld(this,callObjLocation,PVar4,byteCodeGenerator,funcInfo,true);
    }
  }
  else if (OVar1 == knopIndex) {
    pPVar5 = ParseNode::AsParseNodeBin(this);
    Instance = pPVar5->pnode1->location;
    pPVar5 = ParseNode::AsParseNodeBin(this);
    Js::ByteCodeWriter::Element
              (&byteCodeGenerator->m_writer,LdMethodElem,this->location,Instance,
               pPVar5->pnode2->location,false,false);
  }
  else if (OVar1 == knopDot) {
    pPVar5 = ParseNode::AsParseNodeBin(this);
    if (pPVar5->pnode2->nop != knopName) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar6 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                         ,0x2083,"(pnodeTarget->AsParseNodeBin()->pnode2->nop == knopName)",
                         "pnodeTarget->AsParseNodeBin()->pnode2->nop == knopName");
      if (!bVar3) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar6 = 0;
    }
    pPVar5 = ParseNode::AsParseNodeBin(this);
    pPVar7 = ParseNode::AsParseNodeName(pPVar5->pnode2);
    PVar4 = ParseNodeName::PropertyIdFromNameNode(pPVar7);
    EmitMethodFld(this,callObjLocation,PVar4,byteCodeGenerator,funcInfo,true);
  }
  EmitCallI(pnodeCall,0,fIsEval,fHasNewTarget,actualArgCount,byteCodeGenerator,funcInfo,callSiteId,
            spreadIndices);
  return;
}

Assistant:

void EmitCallInstrNoEvalComponents(
    ParseNodeCall *pnodeCall,
    BOOL fIsEval,
    BOOL fHasNewTarget,
    Js::RegSlot thisLocation,
    Js::RegSlot callObjLocation,
    uint32 actualArgCount,
    ByteCodeGenerator *byteCodeGenerator,
    FuncInfo *funcInfo,
    Js::ProfileId callSiteId,
    Js::AuxArray<uint32> *spreadIndices = nullptr)
{
    // Emit the call instruction. The call target is a reference at this point, and we evaluate
    // it as part of doing the actual call.
    // Note that we don't handle the (fEvaluateComponents == TRUE) case in this function.
    // (This function is only called on the !fEvaluateComponents branch in EmitCall.)

    ParseNode *pnodeTarget = pnodeCall->pnodeTarget;

    switch (pnodeTarget->nop)
    {
    case knopDot:
    {
        Assert(pnodeTarget->AsParseNodeBin()->pnode2->nop == knopName);
        Js::PropertyId propertyId = pnodeTarget->AsParseNodeBin()->pnode2->AsParseNodeName()->PropertyIdFromNameNode();

        EmitMethodFld(pnodeTarget, callObjLocation, propertyId, byteCodeGenerator, funcInfo);
        EmitCallI(pnodeCall, /*fEvaluateComponents*/ FALSE, fIsEval, fHasNewTarget, actualArgCount, byteCodeGenerator, funcInfo, callSiteId, spreadIndices);
    }
    break;

    case knopIndex:
    {
        EmitMethodElem(pnodeTarget, pnodeTarget->AsParseNodeBin()->pnode1->location, pnodeTarget->AsParseNodeBin()->pnode2->location, byteCodeGenerator);
        EmitCallI(pnodeCall, /*fEvaluateComponents*/ FALSE, fIsEval, fHasNewTarget, actualArgCount, byteCodeGenerator, funcInfo, callSiteId, spreadIndices);
    }
    break;

    case knopName:
    {
        if (callObjLocation != Js::Constants::NoRegister)
        {
            // We still have to get the property from its instance, so emit CallFld.
            if (thisLocation != callObjLocation)
            {
                funcInfo->ReleaseTmpRegister(thisLocation);
            }
            funcInfo->ReleaseTmpRegister(callObjLocation);

            Js::PropertyId propertyId = pnodeTarget->AsParseNodeName()->PropertyIdFromNameNode();
            EmitMethodFld(pnodeTarget, callObjLocation, propertyId, byteCodeGenerator, funcInfo);
            EmitCallI(pnodeCall, /*fEvaluateComponents*/ FALSE, fIsEval, fHasNewTarget, actualArgCount, byteCodeGenerator, funcInfo, callSiteId, spreadIndices);
            break;
        }
    }
    // FALL THROUGH

    default:
        EmitCallI(pnodeCall, /*fEvaluateComponents*/ FALSE, fIsEval, fHasNewTarget, actualArgCount, byteCodeGenerator, funcInfo, callSiteId, spreadIndices);
        break;
    }
}